

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

void __thiscall QStyleOptionTitleBar::QStyleOptionTitleBar(QStyleOptionTitleBar *this)

{
  undefined8 in_RDI;
  
  QStyleOptionTitleBar(this,(int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

QStyleOptionTitleBar::QStyleOptionTitleBar()
    : QStyleOptionTitleBar(Version)
{
}